

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

bool __thiscall llvm::detail::IEEEFloat::isSmallest(IEEEFloat *this)

{
  uint uVar1;
  Significand *parts;
  
  if (((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) &&
     (this->exponent == this->semantics->minExponent)) {
    uVar1 = this->semantics->precision;
    if (uVar1 - 0x40 < 0xffffff80) {
      parts = (Significand *)(this->significand).parts;
    }
    else {
      parts = &this->significand;
    }
    uVar1 = APInt::tcMSB(&parts->part,uVar1 + 0x40 >> 6);
    return uVar1 == 0;
  }
  return false;
}

Assistant:

bool isNaN() const { return category == fcNaN; }